

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
cmsys::CommandLineArguments::GetRemainingArguments
          (CommandLineArguments *this,int *argc,char ***argv)

{
  Internal *pIVar1;
  long lVar2;
  size_type sVar3;
  char **ppcVar4;
  char *pcVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  
  pIVar1 = this->Internals;
  lVar2 = (long)(pIVar1->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar8 = (long)(pIVar1->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_finish - lVar2 >> 5;
  sVar3 = pIVar1->LastArgument;
  ppcVar4 = (char **)operator_new__(-(ulong)((uVar8 - sVar3) + 1 >> 0x3d != 0) |
                                    (uVar8 - sVar3) * 8 + 8);
  pcVar5 = (char *)operator_new__((pIVar1->Argv0).super_string._M_string_length + 1);
  *ppcVar4 = pcVar5;
  strcpy(pcVar5,(pIVar1->Argv0).super_string._M_dataplus._M_p);
  lVar6 = 1;
  if (sVar3 + 1 < uVar8) {
    plVar7 = (long *)(lVar2 + sVar3 * 0x20 + 0x28);
    lVar6 = 1;
    do {
      pcVar5 = (char *)operator_new__(*plVar7 + 1);
      ppcVar4[lVar6] = pcVar5;
      strcpy(pcVar5,(char *)plVar7[-1]);
      lVar2 = lVar6 + sVar3;
      lVar6 = lVar6 + 1;
      plVar7 = plVar7 + 4;
    } while (lVar2 + 1U < uVar8);
  }
  *argc = (int)lVar6;
  *argv = ppcVar4;
  return;
}

Assistant:

void CommandLineArguments::GetRemainingArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size 
    = this->Internals->Argv.size() - this->Internals->LastArgument + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[ size ];
  args[0] = new char[ this->Internals->Argv0.size() + 1 ];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for ( cc = this->Internals->LastArgument+1; 
    cc < this->Internals->Argv.size(); cc ++ )
    {
    args[cnt] = new char[ this->Internals->Argv[cc].size() + 1];
    strcpy(args[cnt], this->Internals->Argv[cc].c_str());
    cnt ++;
    }
  *argc = cnt;
  *argv = args;
}